

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::throwErrorIfNotArrayOrVector(Expression *e)

{
  byte local_68 [16];
  Structure *local_58;
  CompileMessage local_50;
  
  throwErrorIfNotReadableValue(e);
  (*(e->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_68,e);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_58);
  if ((local_68[0] & 0xfe) == 2) {
    return;
  }
  CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Expected an array or vector type");
  AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

static void throwErrorIfNotArrayOrVector (AST::Expression& e)
    {
        throwErrorIfNotReadableValue (e);

        if (! e.getResultType().isArrayOrVector())
            e.context.throwError (Errors::expectedArrayOrVector());
    }